

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHuf.cpp
# Opt level: O2

int Imf_2_5::hufCompress(unsigned_short *raw,int nRaw,char *compressed)

{
  unsigned_long *puVar1;
  ushort uVar2;
  AutoArray<unsigned_long_*,_65537> AVar3;
  long lVar4;
  AutoArray<unsigned_long,_65537> AVar5;
  int i;
  long lVar6;
  ulong uVar7;
  unsigned_long *puVar8;
  Int64 bits;
  int i_1;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  AutoArray<int,_65537> in_R8;
  Int64 *hcode;
  ulong uVar15;
  uint uVar16;
  Int64 IVar17;
  bool bVar18;
  AutoArray<unsigned_long_*,_65537> fHeap;
  AutoArray<int,_65537> hlink;
  AutoArray<unsigned_long,_65537> local_70;
  long local_68;
  int *local_60;
  AutoArray<unsigned_long,_65537> freq;
  
  if (nRaw == 0) {
    iVar13 = 0;
  }
  else {
    AutoArray<unsigned_long,_65537>::AutoArray(&freq);
    AVar5 = freq;
    for (lVar6 = 0; lVar6 != 0x10001; lVar6 = lVar6 + 1) {
      freq._data[lVar6] = 0;
    }
    uVar7 = 0;
    uVar9 = 0;
    if (0 < nRaw) {
      uVar9 = (ulong)(uint)nRaw;
    }
    for (; uVar9 != uVar7; uVar7 = uVar7 + 1) {
      freq._data[raw[uVar7]] = freq._data[raw[uVar7]] + 1;
    }
    AutoArray<int,_65537>::AutoArray(&hlink);
    AutoArray<unsigned_long_*,_65537>::AutoArray(&fHeap);
    AVar3 = fHeap;
    puVar8 = AVar5._data + -1;
    uVar7 = 0xffffffffffffffff;
    do {
      uVar7 = uVar7 + 1;
      puVar1 = puVar8 + 1;
      puVar8 = puVar8 + 1;
    } while (*puVar1 == 0);
    uVar15 = 0;
    iVar13 = 0;
    for (uVar9 = uVar7; uVar9 < 0x10001; uVar9 = uVar9 + 1) {
      hlink._data[uVar9] = (int)uVar9;
      if (*puVar8 != 0) {
        fHeap._data[iVar13] = puVar8;
        iVar13 = iVar13 + 1;
        uVar15 = uVar9 & 0xffffffff;
      }
      puVar8 = puVar8 + 1;
      in_R8 = hlink;
    }
    local_60 = (int *)CONCAT44(local_60._4_4_,nRaw);
    local_68 = (long)(int)uVar15;
    AVar5._data[local_68 + 1] = 1;
    fHeap._data[iVar13] = AVar5._data + local_68 + 1;
    uVar16 = iVar13 + 1;
    if (0 < iVar13) {
      uVar9 = (long)(int)uVar16 - 2U >> 1;
      do {
        std::
        __adjust_heap<unsigned_long**,long,unsigned_long*,__gnu_cxx::__ops::_Iter_comp_iter<Imf_2_5::(anonymous_namespace)::FHeapCompare>>
                  (AVar3._data,uVar9,(long)(int)uVar16,AVar3._data[uVar9]);
        bVar18 = uVar9 != 0;
        uVar9 = uVar9 - 1;
      } while (bVar18);
    }
    AutoArray<unsigned_long,_65537>::AutoArray(&local_70);
    local_68 = local_68 + 1;
    hcode = (Int64 *)CONCAT44(local_70._data._4_4_,(int)local_70._data);
    memset(hcode,0,0x80008);
    uVar9 = (ulong)uVar16;
    while (1 < (int)uVar9) {
      puVar8 = *fHeap._data;
      std::pop_heap<unsigned_long**,Imf_2_5::(anonymous_namespace)::FHeapCompare>
                (fHeap._data,fHeap._data + uVar9);
      uVar15 = uVar9 - 1;
      uVar10 = (ulong)((long)*fHeap._data - (long)AVar5._data) >> 3;
      std::pop_heap<unsigned_long**,Imf_2_5::(anonymous_namespace)::FHeapCompare>
                (fHeap._data,fHeap._data + (uVar9 - 1));
      uVar11 = (ulong)((long)puVar8 - (long)AVar5._data) >> 3;
      AVar5._data[(int)uVar10] = AVar5._data[(int)uVar10] + AVar5._data[(int)uVar11];
      std::
      __push_heap<unsigned_long**,long,unsigned_long*,__gnu_cxx::__ops::_Iter_comp_val<Imf_2_5::(anonymous_namespace)::FHeapCompare>>
                (fHeap._data,uVar9 - 2,0,fHeap._data[uVar9 - 2],
                 (_Iter_comp_val<Imf_2_5::(anonymous_namespace)::FHeapCompare> *)in_R8._data);
      hcode = (Int64 *)CONCAT44(local_70._data._4_4_,(int)local_70._data);
      do {
        uVar16 = (uint)uVar10;
        hcode[(int)uVar16] = hcode[(int)uVar16] + 1;
        uVar10 = (ulong)(uint)hlink._data[(int)uVar16];
      } while (hlink._data[(int)uVar16] != uVar16);
      hlink._data[(int)uVar16] = (int)uVar11;
      do {
        uVar16 = (uint)uVar11;
        hcode[(int)uVar16] = hcode[(int)uVar16] + 1;
        uVar11 = (ulong)(uint)hlink._data[(int)uVar16];
        uVar9 = uVar15;
      } while (hlink._data[(int)uVar16] != uVar16);
    }
    anon_unknown_0::hufCanonicalCodeTable(hcode);
    memcpy(AVar5._data,(void *)CONCAT44(local_70._data._4_4_,(int)local_70._data),0x80008);
    AutoArray<unsigned_long,_65537>::~AutoArray(&local_70);
    AutoArray<unsigned_long_*,_65537>::~AutoArray(&fHeap);
    AutoArray<int,_65537>::~AutoArray(&hlink);
    AVar5 = freq;
    fHeap._data = (unsigned_long **)0x0;
    local_70._data._0_4_ = 0;
    uVar9 = uVar7 & 0xffffffff;
    hlink._data = (int *)(compressed + 0x14);
    while( true ) {
      uVar16 = (uint)uVar9;
      if ((int)local_68 < (int)uVar16) break;
      uVar15 = (ulong)(int)uVar16;
      uVar9 = AVar5._data[uVar15] & 0x3f;
      if (uVar9 == 0) {
        bits = 0x3a;
        IVar17 = 0xfffffffb;
        while( true ) {
          uVar16 = (int)IVar17 + 6;
          if (((local_68 <= (long)uVar15) || (0x104 < uVar16)) ||
             ((AVar5._data[uVar15 + 1] & 0x3f) != 0)) break;
          uVar15 = uVar15 + 1;
          IVar17 = (Int64)((int)IVar17 + 1);
          bits = bits + 1;
        }
        if (uVar16 < 2) {
          uVar16 = (uint)uVar15;
          goto LAB_00164d89;
        }
        iVar13 = 6;
        if (5 < uVar16) {
          anon_unknown_0::outputBits(6,0x3f,(Int64 *)&fHeap,(int *)&local_70,(char **)&hlink);
          iVar13 = 8;
          bits = IVar17;
        }
        anon_unknown_0::outputBits(iVar13,bits,(Int64 *)&fHeap,(int *)&local_70,(char **)&hlink);
      }
      else {
LAB_00164d89:
        anon_unknown_0::outputBits(6,uVar9,(Int64 *)&fHeap,(int *)&local_70,(char **)&hlink);
        uVar15 = (ulong)uVar16;
      }
      uVar9 = (ulong)((int)uVar15 + 1);
    }
    if (0 < (int)local_70._data) {
      *(char *)hlink._data = (char)((long)fHeap._data << (8U - (char)(int)local_70._data & 0x3f));
      hlink._data = hlink._data + 1;
    }
    fHeap._data = (unsigned_long **)0x0;
    local_70._data._0_4_ = 0;
    lVar12 = (long)(int)local_60;
    iVar13 = 0;
    lVar6 = 1;
    local_60 = hlink._data;
    while( true ) {
      lVar4 = local_68;
      uVar2 = raw[lVar6 + -1];
      if (lVar12 <= lVar6) break;
      if (iVar13 < 0xff && uVar2 == raw[lVar6]) {
        iVar13 = iVar13 + 1;
      }
      else {
        anon_unknown_0::sendCode
                  (freq._data[uVar2],iVar13,freq._data[local_68],(Int64 *)&fHeap,(int *)&local_70,
                   (char **)&hlink);
        iVar13 = 0;
      }
      lVar6 = lVar6 + 1;
    }
    anon_unknown_0::sendCode
              (freq._data[uVar2],iVar13,freq._data[local_68],(Int64 *)&fHeap,(int *)&local_70,
               (char **)&hlink);
    if ((int)local_70._data != 0) {
      *(char *)hlink._data = (char)((long)fHeap._data << (8U - (char)(int)local_70._data & 0x3f));
    }
    iVar14 = (int)hlink._data - (int)local_60;
    *compressed = (char)uVar7;
    compressed[1] = (char)(uVar7 >> 8);
    compressed[2] = (char)(uVar7 >> 0x10);
    compressed[3] = (char)(uVar7 >> 0x18);
    compressed[4] = (char)lVar4;
    compressed[5] = (char)((ulong)lVar4 >> 8);
    compressed[6] = (char)((ulong)lVar4 >> 0x10);
    compressed[7] = (char)((ulong)lVar4 >> 0x18);
    lVar6 = (long)local_60 - (long)(compressed + 0x14);
    compressed[8] = (char)lVar6;
    compressed[9] = (char)((ulong)lVar6 >> 8);
    compressed[10] = (char)((ulong)lVar6 >> 0x10);
    compressed[0xb] = (char)((ulong)lVar6 >> 0x18);
    iVar13 = (int)local_70._data + iVar14 * 8;
    compressed[0xc] = (char)iVar13;
    compressed[0xd] = (char)((uint)iVar13 >> 8);
    compressed[0xe] = (char)((uint)iVar13 >> 0x10);
    compressed[0xf] = (char)((uint)iVar13 >> 0x18);
    iVar13 = (((int)local_70._data + iVar14 * 8 + 7) / 8 + (int)local_60) - (int)compressed;
    compressed[0x10] = '\0';
    compressed[0x11] = '\0';
    compressed[0x12] = '\0';
    compressed[0x13] = '\0';
    AutoArray<unsigned_long,_65537>::~AutoArray(&freq);
  }
  return iVar13;
}

Assistant:

int
hufCompress (const unsigned short raw[],
	     int nRaw,
	     char compressed[])
{
    if (nRaw == 0)
	return 0;

    AutoArray <Int64, HUF_ENCSIZE> freq;

    countFrequencies (freq, raw, nRaw);

    int im = 0;
    int iM = 0;
    hufBuildEncTable (freq, &im, &iM);

    char *tableStart = compressed + 20;
    char *tableEnd   = tableStart;
    hufPackEncTable (freq, im, iM, &tableEnd);
    int tableLength = tableEnd - tableStart;

    char *dataStart = tableEnd;
    int nBits = hufEncode (freq, raw, nRaw, iM, dataStart);
    int dataLength = (nBits + 7) / 8;

    writeUInt (compressed,      im);
    writeUInt (compressed +  4, iM);
    writeUInt (compressed +  8, tableLength);
    writeUInt (compressed + 12, nBits);
    writeUInt (compressed + 16, 0);	// room for future extensions

    return dataStart + dataLength - compressed;
}